

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall google::protobuf::Arena::Init(Arena *this)

{
  long *plVar1;
  long lVar2;
  LogMessage *pLVar3;
  ulong uVar4;
  undefined8 uVar5;
  Block *b;
  long lVar6;
  long *in_FS_OFFSET;
  LogFinisher local_51;
  LogMessage local_50;
  
  lVar6 = lifecycle_id_generator_;
  LOCK();
  UNLOCK();
  lVar2 = lifecycle_id_generator_ + 1;
  *(long *)this = lifecycle_id_generator_;
  lifecycle_id_generator_ = lVar2;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  this[0x28] = (Arena)0x1;
  b = *(Block **)(this + 0x50);
  if ((b != (Block *)0x0) && (uVar4 = *(ulong *)(this + 0x58), uVar4 != 0)) {
    if (uVar4 < 0x20) {
      internal::LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
                 ,0x4f);
      pLVar3 = internal::LogMessage::operator<<
                         (&local_50,
                          "CHECK failed: (options_.initial_block_size) >= (sizeof(Block)): ");
      pLVar3 = internal::LogMessage::operator<<(pLVar3,": Initial block size too small for header.")
      ;
      internal::LogFinisher::operator=(&local_51,pLVar3);
      internal::LogMessage::~LogMessage(&local_50);
      lVar6 = *(long *)this;
      b = *(Block **)(this + 0x50);
      uVar4 = *(ulong *)(this + 0x58);
    }
    b->size = uVar4;
    b->pos = 0x20;
    b->next = (Block *)0x0;
    plVar1 = (long *)*in_FS_OFFSET;
    b->owner = plVar1;
    plVar1[1] = (long)b;
    *plVar1 = lVar6;
    AddBlockInternal(this,b);
    this[0x28] = (Arena)0x0;
  }
  if (*(code **)(this + 0x70) == (code *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = (**(code **)(this + 0x70))(this);
  }
  *(undefined8 *)(this + 0x38) = uVar5;
  return;
}

Assistant:

void Arena::Init() {
#if !defined(__APPLE__)
  lifecycle_id_ = lifecycle_id_generator_.GetNext();
#else
  lifecycle_id_generator_ptr = new google::protobuf::internal::SequenceNumber;
  lifecycle_id_ = lifecycle_id_generator_ptr->GetNext();
#endif
  blocks_ = 0;
  hint_ = 0;
  space_allocated_ = 0;
  owns_first_block_ = true;
  cleanup_list_ = 0;

  if (options_.initial_block != NULL && options_.initial_block_size > 0) {
    GOOGLE_CHECK_GE(options_.initial_block_size, sizeof(Block))
        << ": Initial block size too small for header.";

    // Add first unowned block to list.
    Block* first_block = reinterpret_cast<Block*>(options_.initial_block);
    first_block->size = options_.initial_block_size;
    first_block->pos = kHeaderSize;
    first_block->next = NULL;
    // Thread which calls Init() owns the first block. This allows the
    // single-threaded case to allocate on the first block without taking any
    // locks.
    first_block->owner = &thread_cache();
    SetThreadCacheBlock(first_block);
    AddBlockInternal(first_block);
    owns_first_block_ = false;
  }

  // Call the initialization hook
  if (options_.on_arena_init != NULL) {
    hooks_cookie_ = options_.on_arena_init(this);
  } else {
    hooks_cookie_ = NULL;
  }
}